

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

shared_ptr<Token> __thiscall Tokenizer::nextToken(Tokenizer *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  __shared_ptr_access<TokenizerRule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  __shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RSI;
  shared_ptr<Token> sVar6;
  undefined4 local_108;
  allocator<char> local_102;
  undefined1 local_101;
  undefined1 *local_100;
  undefined8 local_f8;
  string local_f0 [32];
  undefined1 local_d0 [32];
  undefined1 local_b0 [8];
  string str;
  pair<bool,_unsigned_long> result;
  shared_ptr<TokenizerRule> *rule;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_> *__range1
  ;
  long lStack_48;
  TokenType matchTokenType;
  size_t matchSize;
  undefined4 local_38;
  int iStack_34;
  bool match;
  int local_30 [2];
  shared_ptr<Token> local_28;
  Tokenizer *this_local;
  
  this_local = this;
  peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     (in_RSI);
  iVar2 = (*peVar3->_vptr_Readable[2])(peVar3,0);
  if ((char)iVar2 == '\0') {
    local_30[1] = 1;
    local_30[0] = 0;
    iStack_34 = 0;
    local_38 = 0;
    std::make_shared<Token,char_const(&)[10],TokenType,int,int,int>
              ((char (*) [10])&local_28,(TokenType *)"EndOfFile",local_30 + 1,local_30,
               &stack0xffffffffffffffcc);
    std::shared_ptr<Token>::operator=((shared_ptr<Token> *)(in_RSI + 0x28),&local_28);
    std::shared_ptr<Token>::~shared_ptr(&local_28);
    std::shared_ptr<Token>::shared_ptr
              ((shared_ptr<Token> *)this,(shared_ptr<Token> *)(in_RSI + 0x28));
    _Var5._M_pi = extraout_RDX;
  }
  else {
    matchSize._7_1_ = 0;
    lStack_48 = 0;
    __range1._4_4_ = 0;
    __end1 = std::
             vector<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>
             ::begin(&rules);
    rule = (shared_ptr<TokenizerRule> *)
           std::
           vector<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>
           ::end(&rules);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::shared_ptr<TokenizerRule>_*,_std::vector<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>_>
                                       *)&rule), bVar1) {
      this_00 = (__shared_ptr_access<TokenizerRule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                __gnu_cxx::
                __normal_iterator<const_std::shared_ptr<TokenizerRule>_*,_std::vector<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>_>
                ::operator*(&__end1);
      peVar4 = std::__shared_ptr_access<TokenizerRule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      std::shared_ptr<Readable>::shared_ptr
                ((shared_ptr<Readable> *)((long)&str.field_2 + 8),(shared_ptr<Readable> *)in_RSI);
      iVar2 = (**peVar4->_vptr_TokenizerRule)(peVar4,(undefined1 *)((long)&str.field_2 + 8));
      std::shared_ptr<Readable>::~shared_ptr((shared_ptr<Readable> *)((long)&str.field_2 + 8));
      matchSize._7_1_ = (byte)iVar2 & 1;
      lStack_48 = extraout_RDX_00;
      peVar4 = std::__shared_ptr_access<TokenizerRule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      __range1._4_4_ = (*peVar4->_vptr_TokenizerRule[1])();
      if ((matchSize._7_1_ & 1) != 0) break;
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<TokenizerRule>_*,_std::vector<std::shared_ptr<TokenizerRule>,_std::allocator<std::shared_ptr<TokenizerRule>_>_>_>
      ::operator++(&__end1);
    }
    if ((((matchSize._7_1_ & 1) == 0) || (lStack_48 == 0)) || (__range1._4_4_ == 0)) {
      peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(in_RSI);
      iVar2 = (*peVar3->_vptr_Readable[2])(peVar3,0);
      local_101 = (undefined1)iVar2;
      local_100 = &local_101;
      local_f8 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,local_100,local_f8,&local_102);
      local_108 = 0;
      std::
      make_shared<Token,std::__cxx11::string,TokenType,unsigned_long&,unsigned_long&,unsigned_long&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 (TokenType *)local_f0,(unsigned_long *)&local_108,(unsigned_long *)(in_RSI + 0x10),
                 (unsigned_long *)(in_RSI + 0x18));
      std::shared_ptr<Token>::operator=
                ((shared_ptr<Token> *)(in_RSI + 0x28),(shared_ptr<Token> *)local_d0);
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)local_d0);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_102);
      *(long *)(in_RSI + 0x10) = *(long *)(in_RSI + 0x10) + 1;
      *(long *)(in_RSI + 0x20) = *(long *)(in_RSI + 0x20) + 1;
      peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(in_RSI);
      (*peVar3->_vptr_Readable[3])(peVar3,1);
    }
    else {
      peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(in_RSI);
      (*peVar3->_vptr_Readable[5])(local_b0,peVar3,lStack_48);
      std::
      make_shared<Token,std::__cxx11::string&,TokenType&,unsigned_long&,unsigned_long&,unsigned_long&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_d0 + 0x10),(TokenType *)local_b0,(unsigned_long *)((long)&__range1 + 4),
                 (unsigned_long *)(in_RSI + 0x10),(unsigned_long *)(in_RSI + 0x18));
      std::shared_ptr<Token>::operator=
                ((shared_ptr<Token> *)(in_RSI + 0x28),(shared_ptr<Token> *)(local_d0 + 0x10));
      std::shared_ptr<Token>::~shared_ptr((shared_ptr<Token> *)(local_d0 + 0x10));
      bVar1 = Token::isNewLine((string *)local_b0);
      if (bVar1) {
        *(undefined8 *)(in_RSI + 0x20) = 1;
        *(long *)(in_RSI + 0x18) = *(long *)(in_RSI + 0x18) + 1;
      }
      else {
        *(long *)(in_RSI + 0x20) = lStack_48 + *(long *)(in_RSI + 0x20);
      }
      *(long *)(in_RSI + 0x10) = *(long *)(in_RSI + 0x10) + lStack_48;
      peVar3 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(in_RSI);
      (*peVar3->_vptr_Readable[3])(peVar3,lStack_48);
      std::__cxx11::string::~string((string *)local_b0);
    }
    std::shared_ptr<Token>::shared_ptr
              ((shared_ptr<Token> *)this,(shared_ptr<Token> *)(in_RSI + 0x28));
    _Var5._M_pi = extraout_RDX_01;
  }
  sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Token>)sVar6.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Token> Tokenizer::nextToken() noexcept {

  if (this->reader->charAt(0) == '\0') {
    this->token = std::make_shared<Token>("EndOfFile", TokenType::EndOfFile, 0, 0, 0);
    return this->token;
  }

  bool match = false;
  std::size_t matchSize = 0;
  TokenType matchTokenType = TokenType::Unknown;

  for (auto & rule : rules) {
    auto result = rule->tryMatch(this->reader);

    match = result.first;
    matchSize = result.second;
    matchTokenType = rule->getType();

    if (match) { break; }
  }

  if (match && matchSize > 0 && matchTokenType != TokenType::Unknown) {

    std::string str = this->reader->subString(matchSize);

    this->token = std::make_shared<Token>(
      str, matchTokenType, this->sourceIndex, this->sourceLine, this->sourceColumn);

    if (Token::isNewLine(str)) {
      this->sourceColumn = 1;
      this->sourceLine += 1;
    } else {
      this->sourceColumn += matchSize;
    }

    this->sourceIndex += matchSize;

    this->reader->advance(matchSize);

  } else {

    this->token = std::make_shared<Token>(
      std::string{this->reader->charAt(0)}, TokenType::Unknown,
      this->sourceIndex, this->sourceLine, this->sourceColumn);

    this->sourceIndex++;
    this->sourceColumn++;

    this->reader->advance(1);
  }

  return this->token;
}